

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

Index __thiscall MADPComponentDiscreteStates::SampleInitialState(MADPComponentDiscreteStates *this)

{
  pointer pdVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long lVar5;
  double dVar6;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"MADPComponentDiscreteStates::SampleInitialState()",0x31);
    std::__ostream_insert<char,std::char_traits<char>>(local_188," - Error: not initialized. ",0x1b)
    ;
    std::endl<char,std::char_traits<char>>(local_188);
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar4 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar4,&E::typeinfo,E::~E);
  }
  iVar2 = rand();
  pdVar1 = (this->_m_initialStateDistribution->super_SDV).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = (long)(this->_m_initialStateDistribution->super_SDV).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pdVar1;
  if (lVar5 != 0) {
    dVar6 = 0.0;
    uVar3 = 0;
    do {
      dVar6 = dVar6 + pdVar1[uVar3];
      if ((double)iVar2 * 4.656612873077393e-10 <= dVar6) goto LAB_0047b9bd;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < (ulong)(lVar5 >> 3));
  }
  uVar3 = 0;
LAB_0047b9bd:
  return (Index)uVar3;
}

Assistant:

Index MADPComponentDiscreteStates::SampleInitialState() const
{
  if(!_m_initialized)
  {
    stringstream ss;
    ss << "MADPComponentDiscreteStates::SampleInitialState()" <<
      " - Error: not initialized. " << endl;
    throw E(ss);
  }
  
  double randNr=rand() / (RAND_MAX + 1.0);

  double sum=0;
  Index state=0,i;
  for(i=0;i<_m_initialStateDistribution->size();i++)
  {
    sum+= _m_initialStateDistribution->at(i);
    if(randNr<=sum)
    {
      state=i;
      break;
    }
  }

  return(state);
}